

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::CheckResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags,
                SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  bool bVar1;
  int iVar2;
  PipelineResourceDesc *pPVar3;
  IDeviceObject *pIVar4;
  undefined4 extraout_var;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS SVar5;
  uint ArrayIndex;
  
  pPVar3 = ShaderVariableManagerGL::GetResourceDesc(this->m_ParentManager,this->m_ResIndex);
  SVar5 = 1 << (pPVar3->VarType & 0x1f);
  if ((((Flags >> (pPVar3->VarType & 0x1f) & 1) != 0) &&
      ((*StaleVarTypes & SVar5) == SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE)) &&
     (pPVar3->ArraySize != 0)) {
    ArrayIndex = 0;
    do {
      pIVar4 = ShaderVariableManagerGL::TextureBindInfo::Get((TextureBindInfo *)this,ArrayIndex);
      if (pIVar4 == (IDeviceObject *)0x0) {
        if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) == 0) {
          if (pResourceMapping != (IResourceMapping *)0x0) goto LAB_00311658;
          goto LAB_00311678;
        }
LAB_0031167c:
        *StaleVarTypes = *StaleVarTypes | SVar5;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        if (pResourceMapping != (IResourceMapping *)0x0 &&
            (char)((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) >> 3) == '\0') {
LAB_00311658:
          iVar2 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                            (pResourceMapping,pPVar3->Name,(ulong)ArrayIndex);
          if ((IDeviceObject *)CONCAT44(extraout_var,iVar2) != pIVar4 &&
              (IDeviceObject *)CONCAT44(extraout_var,iVar2) != (IDeviceObject *)0x0)
          goto LAB_0031167c;
LAB_00311678:
          bVar1 = false;
        }
      }
    } while ((!bVar1) && (ArrayIndex = ArrayIndex + 1, ArrayIndex < pPVar3->ArraySize));
  }
  return;
}

Assistant:

void CheckResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags, SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
    {
        const ThisImplType* const   pThis   = static_cast<const ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        const SHADER_RESOURCE_VARIABLE_TYPE_FLAGS VarTypeFlag = static_cast<SHADER_RESOURCE_VARIABLE_TYPE_FLAGS>(1u << ResDesc.VarType);
        if ((Flags & VarTypeFlag) == 0)
            return; // This variable type is not being processed

        if ((StaleVarTypes & VarTypeFlag) != 0)
            return; // This variable type is already stale

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const IDeviceObject* const pBoundObj = pThis->Get(ArrInd);
            if ((pBoundObj != nullptr) && (Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0)
                continue;

            if ((pBoundObj == nullptr) && (Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0)
            {
                StaleVarTypes |= VarTypeFlag;
                return;
            }

            if (pResourceMapping != nullptr)
            {
                if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
                {
                    if (pObj != pBoundObj)
                    {
                        StaleVarTypes |= VarTypeFlag;
                        return;
                    }
                }
            }
        }
    }